

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

void __thiscall WorldShuffler::randomize_where_is_lithograph_hint(WorldShuffler *this)

{
  RandomizerWorld *this_00;
  HintSource *hint_source;
  ostream *poVar1;
  Item *item;
  string sStack_1c8;
  stringstream where_is_litho_hint;
  size_type local_1a0;
  ostream local_198 [376];
  
  if (this->_options->_archipelago_world == false) {
    this_00 = this->_world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&where_is_litho_hint,"King Nole\'s Cave sign",
               (allocator<char> *)&sStack_1c8);
    hint_source = RandomizerWorld::hint_source(this_00,(string *)&where_is_litho_hint);
    std::__cxx11::string::~string((string *)&where_is_litho_hint);
    RandomizerWorld::add_used_hint_source(this->_world,hint_source);
    HintSource::text_abi_cxx11_((string *)&where_is_litho_hint,hint_source);
    std::__cxx11::string::~string((string *)&where_is_litho_hint);
    if (local_1a0 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&where_is_litho_hint);
      poVar1 = std::operator<<(local_198,"The lithograph will help you finding the jewels. It is ");
      item = World::item(&this->_world->super_World,'\'');
      random_hint_for_item_abi_cxx11_(&sStack_1c8,this,item);
      poVar1 = std::operator<<(poVar1,(string *)&sStack_1c8);
      std::operator<<(poVar1,".");
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&hint_source->_text,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&where_is_litho_hint);
    }
  }
  return;
}

Assistant:

void WorldShuffler::randomize_where_is_lithograph_hint()
{
    if(_options.archipelago_world())
        return;

    HintSource* knc_sign_source = _world.hint_source("King Nole's Cave sign");

    _world.add_used_hint_source(knc_sign_source);

    if(!knc_sign_source->text().empty())
        return;

    std::stringstream where_is_litho_hint;
    where_is_litho_hint << "The lithograph will help you finding the jewels. It is "
                        << this->random_hint_for_item(_world.item(ITEM_LITHOGRAPH))
                        << ".";

    knc_sign_source->text(where_is_litho_hint.str());
}